

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotScatterEx<ImPlot::GetterXsYs<float>>(char *label_id,GetterXsYs<float> *getter)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  ImVec2 IVar4;
  ImPlotRange IVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  TransformerLogLog transformer;
  float *pfVar12;
  ImPlotPlot *pIVar13;
  undefined1 auVar14 [16];
  double dVar15;
  ulong uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [12];
  double dVar20;
  ImPlotRange *pIVar21;
  ImPlotContext *pIVar22;
  bool bVar23;
  ImU32 col_mk_line;
  ImU32 col_mk_fill;
  long lVar24;
  ImPlotContext *pIVar25;
  int iVar26;
  float *pfVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  ImPlotRange in_XMM6;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  uint local_90;
  undefined8 local_58;
  ImDrawList *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar23 = BeginItem(label_id,2);
  pIVar25 = GImPlot;
  if (bVar23) {
    if ((GImPlot->FitThisFrame == true) && (iVar7 = getter->Count, 0 < iVar7)) {
      pfVar27 = getter->Xs;
      pfVar12 = getter->Ys;
      iVar28 = getter->Offset;
      iVar8 = getter->Stride;
      pIVar13 = GImPlot->CurrentPlot;
      iVar9 = pIVar13->CurrentYAxis;
      uVar10 = (pIVar13->XAxis).Flags;
      pIVar21 = GImPlot->ExtentsY;
      uVar11 = pIVar13->YAxis[iVar9].Flags;
      iVar26 = 0;
      local_48 = (float *)(CONCAT44(local_48._4_4_,uVar11) & 0xffffffff00000020);
      local_90 = uVar10 & 0x20;
      do {
        lVar24 = (long)(((iVar28 + iVar26) % iVar7 + iVar7) % iVar7) * (long)iVar8;
        fVar1 = *(float *)((long)pfVar27 + lVar24);
        dVar17 = (double)fVar1;
        fVar2 = *(float *)((long)pfVar12 + lVar24);
        dVar15 = (double)fVar2;
        if ((uVar10 >> 10 & 1) == 0) {
          if ((long)ABS(dVar17) < 0x7ff0000000000000) {
LAB_001d71ef:
            if ((0.0 < fVar1) || (local_90 == 0)) {
              IVar5 = pIVar25->ExtentsX;
              auVar19._4_8_ = in_XMM6.Max;
              auVar19._0_4_ = IVar5.Min._4_4_;
              auVar34._0_8_ = auVar19._0_8_ << 0x20;
              auVar34._8_4_ = IVar5.Max._0_4_;
              auVar34._12_4_ = IVar5.Max._4_4_;
              uVar29 = -(ulong)(dVar17 < IVar5.Min);
              uVar30 = -(ulong)(auVar34._8_8_ < dVar17);
              uVar16 = (ulong)dVar17 & uVar30;
              auVar35._0_8_ = ~uVar29 & (ulong)IVar5.Min;
              auVar35._8_8_ = ~uVar30 & (ulong)IVar5.Max;
              auVar18._8_4_ = (int)uVar16;
              auVar18._0_8_ = (ulong)dVar17 & uVar29;
              auVar18._12_4_ = (int)(uVar16 >> 0x20);
              in_XMM6 = (ImPlotRange)(auVar35 | auVar18);
              pIVar25->ExtentsX = in_XMM6;
            }
          }
        }
        else if ((((long)ABS(dVar17) < 0x7ff0000000000000) &&
                 (pIVar13->YAxis[iVar9].Range.Min <= dVar15)) &&
                (dVar15 <= pIVar13->YAxis[iVar9].Range.Max)) goto LAB_001d71ef;
        if ((uVar11 >> 10 & 1) == 0) {
          if ((long)ABS(dVar15) < 0x7ff0000000000000) {
LAB_001d7268:
            if ((0.0 < fVar2) || ((int)local_48 == 0)) {
              dVar17 = pIVar21[iVar9].Min;
              dVar20 = pIVar25->ExtentsY[iVar9].Max;
              uVar29 = -(ulong)(dVar15 < dVar17);
              uVar30 = -(ulong)(dVar20 < dVar15);
              uVar16 = (ulong)dVar15 & uVar30;
              auVar33._0_8_ = ~uVar29 & (ulong)dVar17;
              auVar33._8_8_ = ~uVar30 & (ulong)dVar20;
              auVar14._8_4_ = (int)uVar16;
              auVar14._0_8_ = (ulong)dVar15 & uVar29;
              auVar14._12_4_ = (int)(uVar16 >> 0x20);
              pIVar21[iVar9] = (ImPlotRange)(auVar33 | auVar14);
            }
          }
        }
        else if ((((long)ABS(dVar15) < 0x7ff0000000000000) && ((pIVar13->XAxis).Range.Min <= dVar17)
                 ) && (dVar17 <= (pIVar13->XAxis).Range.Max)) goto LAB_001d7268;
        iVar26 = iVar26 + 1;
      } while (iVar7 != iVar26);
    }
    local_50 = GetPlotDrawList();
    iVar7 = (pIVar25->NextItemData).Marker;
    iVar28 = 0;
    if (iVar7 != -1) {
      iVar28 = iVar7;
    }
    PopPlotClipRect();
    PushPlotClipRect((pIVar25->NextItemData).MarkerSize);
    col_mk_line = ImGui::GetColorU32((pIVar25->NextItemData).Colors + 2);
    col_mk_fill = ImGui::GetColorU32((pIVar25->NextItemData).Colors + 3);
    pIVar22 = GImPlot;
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    switch(GImPlot->Scales[transformer.YAxis]) {
    case 0:
      iVar7 = getter->Count;
      if (0 < iVar7) {
        pfVar27 = getter->Xs;
        pfVar12 = getter->Ys;
        iVar8 = getter->Offset;
        fVar1 = (pIVar25->NextItemData).MarkerSize;
        fVar2 = (pIVar25->NextItemData).MarkerWeight;
        iVar9 = getter->Stride;
        iVar26 = 0;
        bVar23 = (pIVar25->NextItemData).RenderMarkerLine;
        bVar6 = (pIVar25->NextItemData).RenderMarkerFill;
        pIVar25 = GImPlot;
        local_48 = pfVar27;
        do {
          lVar24 = (long)(((iVar8 + iVar26) % iVar7 + iVar7) % iVar7) * (long)iVar9;
          IVar4 = pIVar25->PixelRange[transformer.YAxis].Min;
          fVar31 = (float)(pIVar25->Mx *
                           ((double)*(float *)((long)pfVar27 + lVar24) -
                           (pIVar25->CurrentPlot->XAxis).Range.Min) + (double)IVar4.x);
          fVar32 = (float)(pIVar25->My[transformer.YAxis] *
                           ((double)*(float *)((long)pfVar12 + lVar24) -
                           pIVar25->CurrentPlot->YAxis[transformer.YAxis].Range.Min) +
                          (double)IVar4.y);
          local_58 = CONCAT44(fVar32,fVar31);
          pIVar13 = pIVar22->CurrentPlot;
          if ((((pIVar13->PlotRect).Min.x <= fVar31) &&
              (uVar3 = *(undefined8 *)&(pIVar13->PlotRect).Min.y, (float)uVar3 <= fVar32)) &&
             ((fVar31 < (float)((ulong)uVar3 >> 0x20) && (fVar32 < (pIVar13->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<float>>(ImPlot::GetterXsYs<float>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)iVar28 * 8))
                      (fVar1,fVar2,local_50,&local_58,bVar23,col_mk_line,bVar6,col_mk_fill);
            pIVar25 = GImPlot;
            pfVar27 = local_48;
          }
          iVar26 = iVar26 + 1;
        } while (iVar7 != iVar26);
      }
      break;
    case 1:
      iVar7 = getter->Count;
      if (0 < iVar7) {
        pfVar27 = getter->Xs;
        pfVar12 = getter->Ys;
        iVar8 = getter->Offset;
        fVar1 = (pIVar25->NextItemData).MarkerSize;
        fVar2 = (pIVar25->NextItemData).MarkerWeight;
        iVar9 = getter->Stride;
        iVar26 = 0;
        bVar23 = (pIVar25->NextItemData).RenderMarkerLine;
        bVar6 = (pIVar25->NextItemData).RenderMarkerFill;
        do {
          pIVar25 = GImPlot;
          lVar24 = (long)(((iVar8 + iVar26) % iVar7 + iVar7) % iVar7) * (long)iVar9;
          local_48 = (float *)(double)*(float *)((long)pfVar12 + lVar24);
          uStack_40 = 0;
          dVar15 = log10((double)*(float *)((long)pfVar27 + lVar24) /
                         (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar13 = pIVar25->CurrentPlot;
          dVar17 = (pIVar13->XAxis).Range.Min;
          IVar4 = pIVar25->PixelRange[transformer.YAxis].Min;
          fVar31 = (float)(pIVar25->Mx *
                           (((double)(float)(dVar15 / pIVar25->LogDenX) *
                             ((pIVar13->XAxis).Range.Max - dVar17) + dVar17) - dVar17) +
                          (double)IVar4.x);
          fVar32 = (float)(pIVar25->My[transformer.YAxis] *
                           ((double)local_48 - pIVar13->YAxis[transformer.YAxis].Range.Min) +
                          (double)IVar4.y);
          local_58 = CONCAT44(fVar32,fVar31);
          pIVar13 = pIVar22->CurrentPlot;
          if ((((pIVar13->PlotRect).Min.x <= fVar31) && ((pIVar13->PlotRect).Min.y <= fVar32)) &&
             ((fVar31 < (pIVar13->PlotRect).Max.x && (fVar32 < (pIVar13->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<float>>(ImPlot::GetterXsYs<float>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)iVar28 * 8))
                      (fVar1,fVar2,local_50,&local_58,bVar23,col_mk_line,bVar6,col_mk_fill);
          }
          iVar26 = iVar26 + 1;
        } while (iVar7 != iVar26);
      }
      break;
    case 2:
      iVar7 = getter->Count;
      if (0 < iVar7) {
        pfVar27 = getter->Xs;
        pfVar12 = getter->Ys;
        iVar8 = getter->Offset;
        fVar1 = (pIVar25->NextItemData).MarkerSize;
        fVar2 = (pIVar25->NextItemData).MarkerWeight;
        iVar9 = getter->Stride;
        iVar26 = 0;
        bVar23 = (pIVar25->NextItemData).RenderMarkerLine;
        bVar6 = (pIVar25->NextItemData).RenderMarkerFill;
        do {
          pIVar25 = GImPlot;
          lVar24 = (long)(((iVar8 + iVar26) % iVar7 + iVar7) % iVar7) * (long)iVar9;
          local_48 = (float *)(double)*(float *)((long)pfVar27 + lVar24);
          uStack_40 = 0;
          dVar17 = log10((double)*(float *)((long)pfVar12 + lVar24) /
                         GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
          pIVar13 = pIVar25->CurrentPlot;
          dVar15 = pIVar13->YAxis[transformer.YAxis].Range.Min;
          IVar4 = pIVar25->PixelRange[transformer.YAxis].Min;
          fVar31 = (float)(pIVar25->Mx * ((double)local_48 - (pIVar13->XAxis).Range.Min) +
                          (double)IVar4.x);
          fVar32 = (float)(pIVar25->My[transformer.YAxis] *
                           (((double)(float)(dVar17 / pIVar25->LogDenY[transformer.YAxis]) *
                             (pIVar13->YAxis[transformer.YAxis].Range.Max - dVar15) + dVar15) -
                           dVar15) + (double)IVar4.y);
          local_58 = CONCAT44(fVar32,fVar31);
          pIVar13 = pIVar22->CurrentPlot;
          if (((((pIVar13->PlotRect).Min.x <= fVar31) && ((pIVar13->PlotRect).Min.y <= fVar32)) &&
              (fVar31 < (pIVar13->PlotRect).Max.x)) && (fVar32 < (pIVar13->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<float>>(ImPlot::GetterXsYs<float>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)iVar28 * 8))
                      (fVar1,fVar2,local_50,&local_58,bVar23,col_mk_line,bVar6,col_mk_fill);
          }
          iVar26 = iVar26 + 1;
        } while (iVar7 != iVar26);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<float>>
                (*getter,transformer,local_50,iVar28,(pIVar25->NextItemData).MarkerSize,
                 (pIVar25->NextItemData).RenderMarkerLine,col_mk_line,
                 (pIVar25->NextItemData).MarkerWeight,(pIVar25->NextItemData).RenderMarkerFill,
                 col_mk_fill);
    }
    pIVar25 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar25->NextItemData);
    pIVar25->PreviousItem = pIVar25->CurrentItem;
    pIVar25->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotScatterEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_MarkerOutline)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}